

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O2

int CfdGetLastErrorCode(void *handle)

{
  CfdCapiManager *in_RSI;
  CfdException last_error;
  
  cfd::capi::CfdCapiManager::GetLastError(&last_error,in_RSI,handle);
  cfd::core::CfdException::~CfdException(&last_error);
  return last_error.error_code_;
}

Assistant:

int CfdGetLastErrorCode(void* handle) {
  try {
    CfdException last_error = cfd::capi::capi_instance.GetLastError(handle);
    return last_error.GetErrorCode();
  } catch (const CfdException& except) {
    return except.GetErrorCode();
  } catch (...) {
    return kCfdUnknownError;
  }
}